

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void update_mode_start_end_index
               (AV1_COMP *cpi,MB_MODE_INFO *mbmi,int *mode_index_start,int *mode_index_end,
               int last_motion_mode_allowed,int interintra_allowed,int eval_motion_mode)

{
  int interintra_allowed_local;
  int last_motion_mode_allowed_local;
  int *mode_index_end_local;
  int *mode_index_start_local;
  MB_MODE_INFO *mbmi_local;
  AV1_COMP *cpi_local;
  
  *mode_index_start = 0;
  *mode_index_end = last_motion_mode_allowed + interintra_allowed;
  if ((cpi->sf).winner_mode_sf.motion_mode_for_winner_cand != 0) {
    if (eval_motion_mode == 0) {
      *mode_index_end = 0;
    }
    else {
      *mode_index_start = 1;
    }
  }
  if (((cpi->sf).inter_sf.extra_prune_warped != 0) && (BLOCK_16X16 < mbmi->bsize)) {
    *mode_index_end = 0;
  }
  return;
}

Assistant:

static inline void update_mode_start_end_index(
    const AV1_COMP *const cpi, const MB_MODE_INFO *const mbmi,
    int *mode_index_start, int *mode_index_end, int last_motion_mode_allowed,
    int interintra_allowed, int eval_motion_mode) {
  *mode_index_start = (int)SIMPLE_TRANSLATION;
  *mode_index_end = (int)last_motion_mode_allowed + interintra_allowed;
  if (cpi->sf.winner_mode_sf.motion_mode_for_winner_cand) {
    if (!eval_motion_mode) {
      *mode_index_end = (int)SIMPLE_TRANSLATION;
    } else {
      // Set the start index appropriately to process motion modes other than
      // simple translation
      *mode_index_start = 1;
    }
  }
  if (cpi->sf.inter_sf.extra_prune_warped && mbmi->bsize > BLOCK_16X16)
    *mode_index_end = SIMPLE_TRANSLATION;
}